

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleAddRow_16_C(uint16_t *src_ptr,uint32_t *dst_ptr,int src_width)

{
  int x;
  int src_width_local;
  uint32_t *dst_ptr_local;
  uint16_t *src_ptr_local;
  
  dst_ptr_local = dst_ptr;
  src_ptr_local = src_ptr;
  for (x = 0; x < src_width + -1; x = x + 2) {
    *dst_ptr_local = (uint)*src_ptr_local + *dst_ptr_local;
    dst_ptr_local[1] = (uint)src_ptr_local[1] + dst_ptr_local[1];
    src_ptr_local = src_ptr_local + 2;
    dst_ptr_local = dst_ptr_local + 2;
  }
  if ((src_width & 1U) != 0) {
    *dst_ptr_local = (uint)*src_ptr_local + *dst_ptr_local;
  }
  return;
}

Assistant:

void ScaleAddRow_16_C(const uint16_t* src_ptr,
                      uint32_t* dst_ptr,
                      int src_width) {
  int x;
  assert(src_width > 0);
  for (x = 0; x < src_width - 1; x += 2) {
    dst_ptr[0] += src_ptr[0];
    dst_ptr[1] += src_ptr[1];
    src_ptr += 2;
    dst_ptr += 2;
  }
  if (src_width & 1) {
    dst_ptr[0] += src_ptr[0];
  }
}